

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterutils.cpp
# Opt level: O2

void asmjit::v1_14::EmitterUtils::logLabelBound(BaseAssembler *self,Label *label)

{
  FormatFlags FVar1;
  Logger *pLVar2;
  byte *pbVar3;
  ulong uVar4;
  undefined1 *puVar5;
  FormatIndentationGroup local_25c;
  undefined8 local_258;
  ulong uStack_250;
  undefined8 local_248;
  undefined1 *local_240;
  undefined1 local_238 [520];
  
  pLVar2 = (self->super_BaseEmitter)._logger;
  local_240 = local_238;
  uStack_250 = 0;
  local_258 = 0x20;
  local_248 = 0x207;
  local_238[0] = 0;
  FVar1 = (pLVar2->_options)._flags;
  local_25c = kLabel;
  pbVar3 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::FormatIndentationGroup>
                     (&(pLVar2->_options)._indentation,&local_25c);
  String::_opChars((String *)&local_258,kAppend,' ',(ulong)*pbVar3);
  Formatter::formatLabel
            ((String *)&local_258,(pLVar2->_options)._flags,&self->super_BaseEmitter,
             (label->super_Operand).super_Operand_._baseId);
  String::_opChar((String *)&local_258,kAppend,':');
  finishFormattedLine((String *)&local_258,&pLVar2->_options,(uint8_t *)0x0,
                      (ulong)(FVar1 & kMachineCode) - 1,0,0,(self->super_BaseEmitter)._inlineComment
                     );
  uVar4 = uStack_250;
  puVar5 = local_240;
  if ((local_258 & 0xff) < 0x1f) {
    uVar4 = local_258 & 0xff;
    puVar5 = (undefined1 *)((long)&local_258 + 1);
  }
  (*pLVar2->_vptr_Logger[2])(pLVar2,puVar5,uVar4);
  String::reset((String *)&local_258);
  return;
}

Assistant:

void logLabelBound(BaseAssembler* self, const Label& label) noexcept {
  Logger* logger = self->logger();

  StringTmp<512> sb;
  size_t binSize = logger->hasFlag(FormatFlags::kMachineCode) ? size_t(0) : SIZE_MAX;

  sb.appendChars(' ', logger->indentation(FormatIndentationGroup::kLabel));
  Formatter::formatLabel(sb, logger->flags(), self, label.id());
  sb.append(':');
  finishFormattedLine(sb, logger->options(), nullptr, binSize, 0, 0, self->_inlineComment);
  logger->log(sb.data(), sb.size());
}